

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_bitwrite.c
# Opt level: O0

void mpp_writer_put_se(MppWriteCtx *ctx,RK_S32 val)

{
  undefined4 local_18;
  RK_U32 tmp;
  RK_S32 val_local;
  MppWriteCtx *ctx_local;
  
  if (val < 1) {
    local_18 = val * -2;
  }
  else {
    local_18 = val * 2 - 1;
  }
  mpp_writer_put_ue(ctx,local_18);
  return;
}

Assistant:

void mpp_writer_put_se(MppWriteCtx *ctx, RK_S32 val)
{
    RK_U32 tmp;

    if (val > 0)
        tmp = (RK_U32)(2 * val - 1);
    else
        tmp = (RK_U32)(-2 * val);

    mpp_writer_put_ue(ctx, tmp);
}